

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void pgraph_gen_state_celsius(int cnum,mt19937 *rnd,pgraph_state *state)

{
  bool bVar1;
  uint32_t uVar2;
  reference this;
  pointer pRVar3;
  result_type rVar4;
  int local_98;
  int local_94;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int j_1;
  int i_4;
  int j;
  int i_3;
  int i_2;
  int i_1;
  int i;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range1;
  pgraph_state *state_local;
  mt19937 *rnd_local;
  int cnum_local;
  
  hwtest::pgraph::pgraph_celsius_regs
            ((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
              *)&__begin1,&state->chipset);
  __end1 = std::
           vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
           ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                    *)&__begin1);
  reg = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                                     *)&reg), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
           ::operator*(&__end1);
    pRVar3 = std::
             unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
             operator->(this);
    (*pRVar3->_vptr_Register[8])(pRVar3,state,(ulong)(uint)cnum,rnd);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *)&__begin1);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_begin_end = (uint)rVar4 & 0xf;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_edge_flag = (uint)rVar4 & 1;
  state->celsius_pipe_unk48 = 0;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_vtx_state = (uint)rVar4 & 0x70001f3f;
  for (i_2 = 0; i_2 < 8; i_2 = i_2 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtxbuf_offset[i_2] = (uint)rVar4 & 0xffffffc;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = pgraph_celsius_fixup_vtxbuf_format(state,i_2,(uint32_t)rVar4);
    state->celsius_pipe_vtxbuf_format[i_2] = uVar2;
    state->celsius_pipe_vtxbuf_format[i_2] =
         state->celsius_pipe_vtxbuf_format[i_2] & 0xfeffffff |
         (uint)((((ulong)state->celsius_pipe_vtxbuf_format[0] << 0x27) >> 0x3f) << 0x18);
  }
  if ((state->chipset).chipset == 0x10) {
    if ((state->celsius_pipe_vtxbuf_format[1] & 7) == 0) {
      state->celsius_pipe_vtxbuf_format[2] = state->celsius_pipe_vtxbuf_format[2] & 0xfffffffb;
    }
    else {
      state->celsius_pipe_vtxbuf_format[2] = state->celsius_pipe_vtxbuf_format[2] & 0xfffffffb | 4;
    }
  }
  for (i_3 = 0; i_3 < 0x1c; i_3 = i_3 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtx[i_3] = (uint32_t)rVar4;
  }
  for (j = 0; j < 4; j = j + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_junk[j] = (uint32_t)rVar4;
  }
  for (i_4 = 0; i_4 < 0x3c; i_4 = i_4 + 1) {
    for (j_1 = 0; j_1 < 4; j_1 = j_1 + 1) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      state->celsius_pipe_xfrm[i_4][j_1] = (uint32_t)rVar4;
    }
  }
  for (i_5 = 0; i_5 < 0x30; i_5 = i_5 + 1) {
    for (i_6 = 0; i_6 < 3; i_6 = i_6 + 1) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      state->celsius_pipe_light_v[i_5][i_6] = (uint)rVar4 & 0xfffffc00;
    }
  }
  for (i_7 = 0; i_7 < 3; i_7 = i_7 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_light_sx_float((uint32_t)rVar4);
    state->celsius_pipe_light_sa[i_7] = uVar2;
  }
  for (i_8 = 0; i_8 < 0x13; i_8 = i_8 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_light_sx_float((uint32_t)rVar4);
    state->celsius_pipe_light_sb[i_8] = uVar2;
  }
  for (i_9 = 0; i_9 < 0xc; i_9 = i_9 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_light_sx_float((uint32_t)rVar4);
    state->celsius_pipe_light_sc[i_9] = uVar2;
  }
  for (i_10 = 0; i_10 < 0xc; i_10 = i_10 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_light_sx_float((uint32_t)rVar4);
    state->celsius_pipe_light_sd[i_10] = uVar2;
  }
  state->celsius_pipe_light_sa[0] = 0x3f800000;
  state->celsius_pipe_light_sb[0] = 0;
  state->celsius_pipe_light_sc[0] = 0x3f800000;
  state->celsius_pipe_light_sd[0] = 0;
  if ((state->chipset).chipset == 0x10) {
    state->celsius_pipe_xfrm[0x3b][0] = 0;
    state->celsius_pipe_xfrm[0x3b][1] = 0;
    state->celsius_pipe_xfrm[0x3b][2] = 0;
    state->celsius_pipe_xfrm[0x3b][3] = 0;
    state->celsius_pipe_light_v[0x2f][0] = 0;
    state->celsius_pipe_light_v[0x2f][1] = 0;
    state->celsius_pipe_light_v[0x2f][2] = 0;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_broke_ovtx = (rVar4 & 1) != 0;
  }
  else {
    state->celsius_pipe_broke_ovtx = false;
  }
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_ovtx_pos = (uint)rVar4 & 0xf;
  state->celsius_pipe_prev_ovtx_pos = 0xf;
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][0] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][1] = (uint)rVar4 & 0xbfffffff;
    state->celsius_pipe_xvtx[local_94][2] = 0;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][3] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][4] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][5] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][6] = (uint)rVar4 & 0x1ff000;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][7] = (uint)rVar4 & 0xbfffffff;
    state->celsius_pipe_xvtx[local_94][8] = 0;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_light_sx_float((uint32_t)rVar4);
    state->celsius_pipe_xvtx[local_94][9] = uVar2 & 0xfffffbff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][10] = (uint32_t)rVar4;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_xvtx[local_94][0xb] = (uint)rVar4 & 0xffffff01;
    state->celsius_pipe_xvtx[local_94][0xc] = 0;
    state->celsius_pipe_xvtx[local_94][0xd] = 0;
    state->celsius_pipe_xvtx[local_94][0xe] = 0;
    state->celsius_pipe_xvtx[local_94][0xf] = 0x3f800000;
    if (-1 < (long)((ulong)state->bundle_config_b << 0x36)) {
      state->celsius_pipe_xvtx[local_94][6] = state->bundle_point_size << 0xc;
    }
    if (-1 < (long)((ulong)state->bundle_config_b << 0x3a)) {
      state->celsius_pipe_xvtx[local_94][0xb] = state->celsius_pipe_xvtx[local_94][0xb] & 1;
    }
  }
  for (local_98 = 0; local_98 < 0x10; local_98 = local_98 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][0] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][1] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][2] = (uint)rVar4 & 0x1ff000;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][3] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][4] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][5] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][6] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][7] = (uint)rVar4 & 0xbfffffff;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][8] = (uint32_t)rVar4;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar2 = canonical_ovtx_fog((uint32_t)rVar4);
    uVar2 = canonical_light_sx_float(uVar2);
    state->celsius_pipe_ovtx[local_98][9] = uVar2;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][10] = (uint32_t)rVar4;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_ovtx[local_98][0xb] = (uint)rVar4 & 0xffffff01;
    state->celsius_pipe_ovtx[local_98][0xc] = 0;
    state->celsius_pipe_ovtx[local_98][0xd] = 0;
    state->celsius_pipe_ovtx[local_98][0xe] = 0;
    state->celsius_pipe_ovtx[local_98][0xf] = 0x3f800000;
    state->celsius_pipe_ovtx[local_98][2] =
         state->celsius_pipe_ovtx[local_98][2] & 0x7fffffff |
         state->celsius_pipe_ovtx[local_98][0xb] << 0x1f;
  }
  return;
}

Assistant:

void pgraph_gen_state_celsius(int cnum, std::mt19937 &rnd, struct pgraph_state *state) {
	for (auto &reg : pgraph_celsius_regs(state->chipset)) {
		reg->gen(state, cnum, rnd);
	}
	state->celsius_pipe_begin_end = rnd() & 0xf;
	state->celsius_pipe_edge_flag = rnd() & 0x1;
	state->celsius_pipe_unk48 = 0;
	state->celsius_pipe_vtx_state = rnd() & 0x70001f3f;
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = rnd() & 0x0ffffffc;
		state->celsius_pipe_vtxbuf_format[i] = pgraph_celsius_fixup_vtxbuf_format(state, i, rnd());
		insrt(state->celsius_pipe_vtxbuf_format[i], 24, 1, extr(state->celsius_pipe_vtxbuf_format[0], 24, 1));
	}
	if (state->chipset.chipset == 0x10) {
		if (extr(state->celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 0);
		else
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 1);
	}
	for (int i = 0; i < 0x1c; i++)
		state->celsius_pipe_vtx[i] = rnd();
	for (int i = 0; i < 4; i++)
		state->celsius_pipe_junk[i] = rnd();
	for (int i = 0; i < 0x3c; i++)
		for (int j = 0; j < 4; j++) {
			state->celsius_pipe_xfrm[i][j] = rnd();
		}
	for (int i = 0; i < 0x30; i++)
		for (int j = 0; j < 3; j++) {
			state->celsius_pipe_light_v[i][j] = rnd() & 0xfffffc00;
		}
	for (int i = 0; i < 3; i++)
		state->celsius_pipe_light_sa[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 19; i++)
		state->celsius_pipe_light_sb[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sc[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sd[i] = canonical_light_sx_float(rnd());
	state->celsius_pipe_light_sa[0] = 0x3f800000;
	state->celsius_pipe_light_sb[0] = 0;
	state->celsius_pipe_light_sc[0] = 0x3f800000;
	state->celsius_pipe_light_sd[0] = 0;
	if (state->chipset.chipset == 0x10) {
		state->celsius_pipe_xfrm[59][0] = 0;
		state->celsius_pipe_xfrm[59][1] = 0;
		state->celsius_pipe_xfrm[59][2] = 0;
		state->celsius_pipe_xfrm[59][3] = 0;
		state->celsius_pipe_light_v[47][0] = 0;
		state->celsius_pipe_light_v[47][1] = 0;
		state->celsius_pipe_light_v[47][2] = 0;
		state->celsius_pipe_broke_ovtx = rnd() & 1;
	} else {
		state->celsius_pipe_broke_ovtx = false;
	}
	state->celsius_pipe_ovtx_pos = rnd() & 0xf;
	state->celsius_pipe_prev_ovtx_pos = 0xf;
	for (int i = 0; i < 3; i++) {
		// XXX clean this.
		state->celsius_pipe_xvtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][2] = 0;
		state->celsius_pipe_xvtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][6] = rnd() & 0x001ff000;
		state->celsius_pipe_xvtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][8] = 0;
		state->celsius_pipe_xvtx[i][9] = canonical_light_sx_float(rnd()) & ~0x400;
		state->celsius_pipe_xvtx[i][10] = rnd();
		state->celsius_pipe_xvtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_xvtx[i][12] = 0;
		state->celsius_pipe_xvtx[i][13] = 0;
		state->celsius_pipe_xvtx[i][14] = 0;
		state->celsius_pipe_xvtx[i][15] = 0x3f800000;
		/* If point params are disabled, point size comes from the global state.
		 * Since we have to load global state before pipe state, there's apparently
		 * no way to cheat here...  */
		if (!extr(state->bundle_config_b, 9, 1))
			state->celsius_pipe_xvtx[i][6] = state->bundle_point_size << 12;
		/* Same for specular enable.  */
		if (!extr(state->bundle_config_b, 5, 1))
			state->celsius_pipe_xvtx[i][11] &= 1;
	}
	for (int i = 0; i < 0x10; i++) {
		// XXX clean this.
		state->celsius_pipe_ovtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][2] = rnd() & 0x001ff000;
		state->celsius_pipe_ovtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][6] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][8] = rnd();
		state->celsius_pipe_ovtx[i][9] = canonical_light_sx_float(canonical_ovtx_fog(rnd()));
		state->celsius_pipe_ovtx[i][10] = rnd();
		state->celsius_pipe_ovtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_ovtx[i][12] = 0;
		state->celsius_pipe_ovtx[i][13] = 0;
		state->celsius_pipe_ovtx[i][14] = 0;
		state->celsius_pipe_ovtx[i][15] = 0x3f800000;
		insrt(state->celsius_pipe_ovtx[i][2], 31, 1, extr(state->celsius_pipe_ovtx[i][11], 0, 1));
	}
}